

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cost.cpp
# Opt level: O0

void __thiscall iDynTree::optimalcontrol::Cost::~Cost(Cost *this)

{
  code *pcVar1;
  Cost *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Cost::~Cost()
        { }